

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FFSMarshalInstallPreciousMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  undefined8 uVar1;
  FFSFormatBlock *pFVar2;
  FFSFormatList in_RDI;
  FMContext Tmp;
  TSMetadataMsg in_stack_00000058;
  SstStream in_stack_00000060;
  
  if (in_RDI[0x11].Next == (FFSFormatBlock *)0x0) {
    uVar1 = create_local_FMcontext();
    pFVar2 = (FFSFormatBlock *)create_FFSContext_FM(uVar1);
    in_RDI[0x11].Next = pFVar2;
    free_FMcontext(uVar1);
  }
  LoadFormats((SstStream)Tmp,in_RDI);
  LoadAttributes(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

extern void FFSMarshalInstallPreciousMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    if (!Stream->ReaderFFSContext)
    {
        FMContext Tmp = create_local_FMcontext();
        Stream->ReaderFFSContext = create_FFSContext_FM(Tmp);
        free_FMcontext(Tmp);
    }

    LoadFormats(Stream, MetaData->Formats);

    LoadAttributes(Stream, MetaData);
}